

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::elu(tensor *dest,tensor *src,float alpha)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t i;
  long lVar4;
  float fVar5;
  
  iVar2 = (*dest->_vptr_tensor[3])();
  iVar3 = (*src->_vptr_tensor[2])(src);
  lVar1 = src->m_size;
  for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
    fVar5 = *(float *)(CONCAT44(extraout_var_00,iVar3) + lVar4 * 4);
    if (fVar5 <= 0.0) {
      fVar5 = expf(fVar5);
      fVar5 = (fVar5 + -1.0) * alpha;
    }
    *(float *)(CONCAT44(extraout_var,iVar2) + lVar4 * 4) = fVar5;
  }
  return;
}

Assistant:

void elu (
            tensor& dest,
            const tensor& src,
            const float alpha
        )
        {
            const auto d = dest.host();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
            {
                if (s[i] > 0)
                    d[i] = s[i];
                else
                    d[i] = alpha * (std::exp(s[i]) - 1.0f);
            }
        }